

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Sector_SetDamage(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  sector_t *psVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FName local_3c;
  FSectorTagIterator local_38;
  
  if (arg0 == 0) {
    local_38.start = 0;
  }
  else {
    local_38.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  local_38.searchtag = arg0;
  uVar2 = FSectorTagIterator::Next(&local_38);
  if (-1 < (int)uVar2) {
    iVar3 = 0x100;
    if (arg1 < 0x32) {
      iVar3 = 5;
    }
    iVar4 = 1;
    if (arg1 < 0x32) {
      iVar4 = 0x20;
    }
    iVar5 = 0;
    if (0x13 < arg1) {
      iVar5 = iVar3;
    }
    do {
      psVar1 = sectors;
      if (arg3 < 1) {
        arg3 = iVar4;
        arg4 = iVar5;
      }
      sectors[uVar2].damageamount = (int)(short)arg1;
      MODtoDamageType((int)&local_3c);
      psVar1[uVar2].damagetype.super_FName.Index = local_3c.Index;
      psVar1[uVar2].damageinterval = (short)arg3;
      psVar1[uVar2].leakydamage = (short)arg4;
      uVar2 = FSectorTagIterator::Next(&local_38);
    } while (-1 < (int)uVar2);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetDamage)
// Sector_SetDamage (tag, amount, mod, interval, leaky)
{
	// The sector still stores the mod in its old format because
	// adding an FName to the sector_t structure might cause
	// problems by adding an unwanted constructor.
	// Since it doesn't really matter whether the type is translated
	// here or in P_PlayerInSpecialSector I think it's the best solution.
	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		if (arg3 <= 0)	// emulate old and hacky method to handle leakiness.
		{
			if (arg1 < 20)
			{
				arg4 = 0;
				arg3 = 32;
			}
			else if (arg1 < 50)
			{
				arg4 = 5;
				arg3 = 32;
			}
			else
			{
				arg4 = 256;
				arg3 = 1;
			}
		}
		sectors[secnum].damageamount = (short)arg1;
		sectors[secnum].damagetype = MODtoDamageType(arg2);
		sectors[secnum].damageinterval = (short)arg3;
		sectors[secnum].leakydamage = (short)arg4;
	}
	return true;
}